

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

void __thiscall wtlgo::bf::ASTLoop::compute(ASTLoop *this,VM *vm)

{
  int iVar1;
  pointer pBVar2;
  undefined4 extraout_var;
  pointer pCVar3;
  undefined4 extraout_var_00;
  VM *vm_local;
  ASTLoop *this_local;
  
  while( true ) {
    pBVar2 = std::unique_ptr<BasicTape,_std::default_delete<BasicTape>_>::operator->(&vm->tape);
    iVar1 = (*pBVar2->_vptr_BasicTape[2])();
    pCVar3 = std::unique_ptr<Cell,_std::default_delete<Cell>_>::operator->
                       ((unique_ptr<Cell,_std::default_delete<Cell>_> *)CONCAT44(extraout_var,iVar1)
                       );
    iVar1 = (*pCVar3->_vptr_Cell[4])();
    if (*(long *)CONCAT44(extraout_var_00,iVar1) == 0) break;
    ASTBody::compute(&this->super_ASTBody,vm);
  }
  return;
}

Assistant:

void ASTLoop::compute(VM& vm) const {
    while(vm.tape->get()->get()) {
        ASTBody::compute(vm);
    }
}